

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.h
# Opt level: O0

void __thiscall
llvm::sys::fs::directory_iterator::directory_iterator
          (directory_iterator *this,Twine *path,error_code *ec,bool follow_symlinks)

{
  element_type *this_00;
  undefined1 in_R8B;
  StringRef SVar1;
  error_code eVar2;
  DirIterState *local_e8;
  size_t local_e0;
  undefined4 uStack_d4;
  undefined1 local_c8 [8];
  SmallString<128U> path_storage;
  bool follow_symlinks_local;
  error_code *ec_local;
  Twine *path_local;
  directory_iterator *this_local;
  
  std::shared_ptr<llvm::sys::fs::detail::DirIterState>::shared_ptr(&this->State);
  this->FollowSymlinks = follow_symlinks;
  std::make_shared<llvm::sys::fs::detail::DirIterState>();
  std::shared_ptr<llvm::sys::fs::detail::DirIterState>::operator=
            (&this->State,
             (shared_ptr<llvm::sys::fs::detail::DirIterState> *)
             (path_storage.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.
              InlineElts + 0x78));
  std::shared_ptr<llvm::sys::fs::detail::DirIterState>::~shared_ptr
            ((shared_ptr<llvm::sys::fs::detail::DirIterState> *)
             (path_storage.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.
              InlineElts + 0x78));
  SmallString<128U>::SmallString((SmallString<128U> *)local_c8);
  this_00 = std::
            __shared_ptr_access<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  SVar1 = Twine::toStringRef(path,(SmallVectorImpl<char> *)local_c8);
  local_e8 = (DirIterState *)SVar1.Data;
  local_e0 = SVar1.Length;
  SVar1.Length._0_1_ = this->FollowSymlinks & 1;
  SVar1.Data = (char *)local_e0;
  SVar1.Length._1_7_ = 0;
  eVar2 = detail::directory_iterator_construct((detail *)this_00,local_e8,SVar1,(bool)in_R8B);
  *(ulong *)ec = CONCAT44(uStack_d4,eVar2._M_value);
  ec->_M_cat = eVar2._M_cat;
  update_error_code_for_current_entry(this,ec);
  SmallString<128U>::~SmallString((SmallString<128U> *)local_c8);
  return;
}

Assistant:

explicit directory_iterator(const Twine &path, std::error_code &ec,
                              bool follow_symlinks = true)
      : FollowSymlinks(follow_symlinks) {
    State = std::make_shared<detail::DirIterState>();
    SmallString<128> path_storage;
    ec = detail::directory_iterator_construct(
        *State, path.toStringRef(path_storage), FollowSymlinks);
    update_error_code_for_current_entry(ec);
  }